

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O3

void deqp::gls::StateQueryUtil::queryProgramState
               (ResultCollector *result,CallLogWrapper *gl,QueryType type,GLuint program,
               GLenum pname,QueriedState *state)

{
  bool bVar1;
  StateQueryMemoryWriteGuard<int> value;
  StateQueryMemoryWriteGuard<int[3]> local_48;
  
  if (type == QUERY_PROGRAM_INTEGER_VEC3) {
    local_48.m_value[1] = -0x21212122;
    local_48.m_value[2] = -0x21212122;
    local_48.m_postguard[0] = -0x21212122;
    local_48.m_postguard[1] = -0x21212122;
    local_48.m_preguard[0] = -0x21212122;
    local_48.m_preguard[1] = -0x21212122;
    local_48.m_preguard[2] = -0x21212122;
    local_48.m_value[0] = -0x21212122;
    local_48.m_postguard[2] = -0x21212122;
    glu::CallLogWrapper::glGetProgramiv(gl,program,pname,local_48.m_value);
    bVar1 = checkError(result,gl,"glGetProgramiv");
    if (bVar1) {
      bVar1 = StateQueryMemoryWriteGuard<int[3]>::verifyValidity(&local_48,result);
      if (bVar1) {
        state->m_type = DATATYPE_INTEGER_VEC3;
        (state->m_v).vInt64 = CONCAT44(local_48.m_value[1],local_48.m_value[0]);
        (state->m_v).vIntVec3[2] = local_48.m_value[2];
      }
    }
  }
  else if (type == QUERY_PROGRAM_INTEGER) {
    local_48.m_preguard[0] = -0x21212122;
    local_48.m_preguard[1] = -0x21212122;
    local_48.m_preguard[2] = -0x21212122;
    glu::CallLogWrapper::glGetProgramiv(gl,program,pname,local_48.m_preguard + 1);
    bVar1 = checkError(result,gl,"glGetProgramiv");
    if (bVar1) {
      bVar1 = StateQueryMemoryWriteGuard<int>::verifyValidity
                        ((StateQueryMemoryWriteGuard<int> *)&local_48,result);
      if (bVar1) {
        state->m_type = DATATYPE_INTEGER;
        (state->m_v).vInt = local_48.m_preguard[1];
      }
    }
  }
  return;
}

Assistant:

void queryProgramState (tcu::ResultCollector& result, glu::CallLogWrapper& gl, QueryType type, glw::GLuint program, glw::GLenum pname, QueriedState& state)
{
	switch (type)
	{
		case QUERY_PROGRAM_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLint> value;
			gl.glGetProgramiv(program, pname, &value);

			if (!checkError(result, gl, "glGetProgramiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_PROGRAM_INTEGER_VEC3:
		{
			StateQueryMemoryWriteGuard<glw::GLint[3]> value;
			gl.glGetProgramiv(program, pname, value);

			if (!checkError(result, gl, "glGetProgramiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		default:
			DE_ASSERT(false);
	}
}